

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  OneofOptions *pOVar1;
  OneofOptions *pOVar2;
  OneofDescriptor *in_RDI;
  OneofOptions *in_stack_ffffffffffffffc8;
  OneofDescriptorProto *in_stack_ffffffffffffffd0;
  
  name_abi_cxx11_(in_RDI);
  OneofDescriptorProto::set_name(in_stack_ffffffffffffffd0,(string *)in_stack_ffffffffffffffc8);
  pOVar1 = options(in_RDI);
  pOVar2 = OneofOptions::default_instance();
  if (pOVar1 != pOVar2) {
    pOVar1 = OneofDescriptorProto::mutable_options((OneofDescriptorProto *)0x4b6bcf);
    options(in_RDI);
    OneofOptions::CopyFrom(pOVar1,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}